

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

Span * __thiscall swrenderer::FCoverageBuffer::AllocSpan(FCoverageBuffer *this)

{
  Span *local_18;
  Span *span;
  FCoverageBuffer *this_local;
  
  if (this->FreeSpans == (Span *)0x0) {
    local_18 = (Span *)FMemArena::Alloc(&this->SpanArena,0x10);
  }
  else {
    local_18 = this->FreeSpans;
    this->FreeSpans = local_18->NextSpan;
  }
  return local_18;
}

Assistant:

FCoverageBuffer::Span *FCoverageBuffer::AllocSpan()
{
	Span *span;

	if (FreeSpans != NULL)
	{
		span = FreeSpans;
		FreeSpans = span->NextSpan;
	}
	else
	{
		span = (Span *)SpanArena.Alloc(sizeof(Span));
	}
	return span;
}